

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

void base64_decode(char *in,char *out)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  unsigned_long blen;
  long local_28;
  
  sVar4 = strlen(in);
  iVar3 = (int)sVar4;
  pcVar5 = out;
  if (*in == '$') {
    pcVar5 = (char *)malloc((long)iVar3);
  }
  lVar6 = 0;
  if (iVar3 < 1) {
    lVar9 = 0;
  }
  else {
    iVar7 = 0;
    do {
      lVar9 = (long)iVar7;
      if (in[lVar9] == '$') {
        lVar9 = (long)iVar7 + 2;
        if (in[(long)iVar7 + 1] == '$') {
          iVar7 = (int)lVar9;
        }
        else {
          do {
            lVar8 = lVar9;
            if (in[lVar9] == '\0') break;
            lVar8 = lVar9 + 1;
            pcVar1 = in + lVar9;
            lVar9 = lVar8;
          } while (*pcVar1 != '$');
          iVar7 = (int)lVar8;
          lVar9 = (long)iVar7;
        }
      }
      pcVar5[lVar6] = ""[in[lVar9 + 1]] >> 4 | ""[in[lVar9]] << 2;
      pcVar5[lVar6 + 1] = ""[in[lVar9 + 2]] >> 2 | ""[in[lVar9 + 1]] << 4;
      pcVar5[lVar6 + 2] = ""[in[lVar9 + 2]] << 6 | ""[in[lVar9 + 3]];
      lVar6 = lVar6 + 3;
      iVar7 = iVar7 + 4;
    } while (iVar7 < iVar3);
    lVar9 = (long)iVar7;
  }
  iVar3 = (int)lVar6;
  cVar2 = in[lVar9 + -2];
  if (((cVar2 == '=') || (cVar2 == '\0')) && ((in[lVar9 + -1] == '=' || (in[lVar9 + -1] == '\0'))))
  {
    iVar3 = iVar3 + -1;
  }
  if (in[lVar9 + -3] == '=') {
    if (cVar2 != '=') goto LAB_001b9b00;
  }
  else {
    if (cVar2 != '\0') goto LAB_001b9b0a;
LAB_001b9b00:
    if (in[lVar9 + -1] != '\0') goto LAB_001b9b0a;
  }
  iVar3 = iVar3 + -1;
LAB_001b9b0a:
  pcVar5[iVar3] = '\0';
  if (*in == '$') {
    iVar7 = base64_strlen(in);
    local_28 = (long)iVar7;
    iVar3 = uncompress(out,&local_28,pcVar5,(long)iVar3);
    free(pcVar5);
    if (iVar3 != 0) {
      lVar6 = ftell((FILE *)loginfo.flog);
      if (iVar3 == -5) {
        pcVar5 = "Invalid size";
      }
      else if (iVar3 == -4) {
        pcVar5 = "Out of memory";
      }
      else {
        pcVar5 = "(unknown error)";
        if (iVar3 == -3) {
          pcVar5 = "Corrupted file";
        }
      }
      raw_printf("Decompressing save file failed at %ld: %s",lVar6,pcVar5);
      terminate();
    }
  }
  return;
}

Assistant:

static void base64_decode(const char *in, char *out)
{
    int i, len = strlen(in), pos = 0;
    char *o = out;

    if (*in == '$')
	o = malloc(len);

    for (i = 0; i < len; i += 4) {
	/* skip data between $ signs, it's the header for compressed data */
	if (in[i] == '$') {
	    for (i += 2; in[i-1] != '$' && in[i]; i++)
		/* empty */;
	}

	/* decode blocks; padding '=' are converted to 0 in the decoding table */
	o[pos  ] =   b64d[(int)in[i  ]] << 2          | b64d[(int)in[i+1]] >> 4;
	o[pos+1] =   b64d[(int)in[i+1]] << 4          | b64d[(int)in[i+2]] >> 2;
	o[pos+2] = ((b64d[(int)in[i+2]] << 6) & 0xc0) | b64d[(int)in[i+3]];
	pos += 3;
    }

    i -= 4;
    if ((in[i+2] == '=' || !in[i+2]) && (in[i+3] == '=' || !in[i+3])) pos--;
    if ((in[i+1] == '=' || !in[i+2]) && (in[i+2] == '=' || !in[i+3])) pos--;

    o[pos] = 0;

    if (*in == '$') {
	unsigned long blen = base64_strlen(in);
	int errcode = uncompress((unsigned char *)out, &blen,
				 (unsigned char *)o, pos);
	free(o);
	if (errcode != Z_OK) {
	    raw_printf("Decompressing save file failed at %ld: %s",
		       ftell(loginfo.flog),
		       errcode == Z_MEM_ERROR ? "Out of memory" :
		       errcode == Z_BUF_ERROR ? "Invalid size" :
		       errcode == Z_DATA_ERROR ? "Corrupted file" :
		       "(unknown error)");
	    terminate();
	}
    }
}